

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * __thiscall
cmGeneratorExpressionInterpreter::Evaluate
          (cmGeneratorExpressionInterpreter *this,string *expression,string *property)

{
  cmGeneratorTarget *target;
  bool bVar1;
  pointer this_00;
  string *psVar2;
  bool local_fc;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_48 [32];
  cmGeneratorExpression local_28;
  string *property_local;
  string *expression_local;
  cmGeneratorExpressionInterpreter *this_local;
  
  local_28.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)property;
  property_local = expression;
  expression_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)expression);
  cmGeneratorExpression::Parse(&local_28,(string *)this);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  operator=(&this->CompiledGeneratorExpression,
            (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             *)&local_28);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_28);
  std::__cxx11::string::~string(local_48);
  target = this->HeadTarget;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_28.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi,"COMPILE_FLAGS");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"COMPILE_OPTIONS",&local_f9);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_f8,
               (string *)
               local_28.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_d8,target,&local_f8,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  else {
    std::__cxx11::string::~string((string *)&local_f8);
  }
  this_00 = std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::operator->(&this->CompiledGeneratorExpression);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,this->LocalGenerator,&this->Config,this->HeadTarget,
                      (cmGeneratorExpressionDAGChecker *)local_d8,(cmGeneratorTarget *)0x0,
                      &this->Language);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_d8);
  return psVar2;
}

Assistant:

const std::string& cmGeneratorExpressionInterpreter::Evaluate(
  std::string expression, const std::string& property)
{
  this->CompiledGeneratorExpression =
    this->GeneratorExpression.Parse(std::move(expression));

  // Specify COMPILE_OPTIONS to DAGchecker, same semantic as COMPILE_FLAGS
  cmGeneratorExpressionDAGChecker dagChecker(
    this->HeadTarget,
    property == "COMPILE_FLAGS" ? "COMPILE_OPTIONS" : property, nullptr,
    nullptr);

  return this->CompiledGeneratorExpression->Evaluate(
    this->LocalGenerator, this->Config, this->HeadTarget, &dagChecker, nullptr,
    this->Language);
}